

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINAnalyzerSettings.cpp
# Opt level: O2

void __thiscall LINAnalyzerSettings::LoadSettings(LINAnalyzerSettings *this,char *settings)

{
  SimpleArchive text_archive;
  
  SimpleArchive::SimpleArchive(&text_archive);
  SimpleArchive::SetString((char *)&text_archive);
  SimpleArchive::operator>>(&text_archive,&this->mInputChannel);
  SimpleArchive::operator>>(&text_archive,&this->mBitRate);
  SimpleArchive::operator>>(&text_archive,&this->mLINVersion);
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(&text_archive);
  return;
}

Assistant:

void LINAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    text_archive >> mInputChannel;
    text_archive >> mBitRate;
    text_archive >> mLINVersion;

    ClearChannels();
    AddChannel( mInputChannel, "LIN", true );

    UpdateInterfacesFromSettings();
}